

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O0

rectangle * __thiscall
dlib::font::
compute_cursor_rect<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
          (font *this,rectangle *rect,
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          *str,unsigned_long index,size_type first,size_type last)

{
  bool bVar1;
  unsigned_short uVar2;
  size_type sVar3;
  const_reference pvVar4;
  letter *this_00;
  long lVar5;
  long lVar6;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RCX;
  rectangle *in_RDX;
  long *in_RSI;
  rectangle *in_RDI;
  ulong in_R8;
  ulong in_R9;
  ulong in_stack_00000008;
  size_type i;
  int count;
  long y;
  long x;
  font *f;
  size_type in_stack_ffffffffffffff68;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff70;
  long lVar7;
  ulong local_50;
  int local_44;
  long local_40;
  long local_38;
  
  if (in_stack_00000008 == 0xffffffffffffffff) {
    sVar3 = std::__cxx11::
            basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
            ::size(in_RCX);
    in_stack_00000008 = sVar3 - 1;
  }
  local_38 = (**(code **)(*in_RSI + 0x30))();
  local_40 = 0;
  local_44 = 0;
  sVar3 = std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::size(in_RCX);
  local_50 = in_R9;
  if (sVar3 != 0) {
    for (; local_50 <= in_stack_00000008 && local_50 < in_R8; local_50 = local_50 + 1) {
      local_44 = local_44 + 1;
      pvVar4 = std::__cxx11::
               basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
               ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (*pvVar4 == 10) {
        local_38 = (**(code **)(*in_RSI + 0x30))();
        lVar5 = (**(code **)(*in_RSI + 0x20))();
        local_40 = lVar5 + local_40;
        local_44 = 0;
      }
      else {
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        bVar1 = is_combining_char<unsigned_int>((uint)in_stack_ffffffffffffff70);
        if ((!bVar1) &&
           (pvVar4 = std::__cxx11::
                     basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68),
           *pvVar4 != 0xd)) {
          pvVar4 = std::__cxx11::
                   basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          this_00 = (letter *)(**(code **)(*in_RSI + 0x18))(in_RSI,*pvVar4);
          uVar2 = letter::width(this_00);
          local_38 = (ulong)uVar2 + local_38;
        }
      }
    }
  }
  lVar5 = rectangle::left(in_RDX);
  local_38 = lVar5 + local_38;
  lVar5 = rectangle::top(in_RDX);
  if (local_44 == 0) {
    local_38 = local_38 + -1;
  }
  lVar7 = lVar5 + local_40;
  lVar6 = (**(code **)(*in_RSI + 0x20))();
  rectangle::rectangle(in_RDI,local_38,lVar5 + local_40,local_38,lVar7 + lVar6 + -1);
  return in_RDI;
}

Assistant:

const rectangle compute_cursor_rect (
            const rectangle& rect,
            const std::basic_string<T,traits,alloc>& str,
            unsigned long index,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos)
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\trectangle font::compute_cursor_rect()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tindex:  " << index
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            const font& f = *this;

            if (last == string::npos)
                last = str.size()-1;

            long x = f.left_overflow();
            long y = 0;
            int count = 0;

            if (str.size() != 0)
            {
                for (typename string::size_type i = first; i <= last && i < index; ++i)
                {
                    ++count;
                    if (str[i] == '\n')
                    {
                        x = f.left_overflow();
                        y += f.height();
                        count = 0;
                    }
                    else if (is_combining_char(str[i]) == false && 
                             str[i] != '\r')
                    {
                        x += f[str[i]].width();
                    }
                }
            }

            x += rect.left();
            y += rect.top();

            // if the cursor is at the start of a line then back it up one pixel
            if (count == 0)
                --x;

            return rectangle(x,y,x,y+f.height()-1);
        }